

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phyr_reporter.h
# Opt level: O2

void __thiscall phyr::ProgressReporter::endReport(ProgressReporter *this,string *p_token)

{
  __type _Var1;
  undefined8 *puVar2;
  char *pcVar3;
  undefined1 *local_38;
  undefined8 local_30;
  undefined1 local_28 [16];
  
  if (this->state == ACQUIRED) {
    _Var1 = std::operator==(&this->token,p_token);
    if (_Var1) {
      Timer::resetTimer((this->timer)._M_t.
                        super___uniq_ptr_impl<phyr::Timer,_std::default_delete<phyr::Timer>_>._M_t.
                        super__Tuple_impl<0UL,_phyr::Timer_*,_std::default_delete<phyr::Timer>_>.
                        super__Head_base<0UL,_phyr::Timer_*,_false>._M_head_impl);
      this->state = AVAILABLE;
      local_38 = local_28;
      local_30 = 0;
      local_28[0] = 0;
      std::__cxx11::string::operator=((string *)&this->token,(string *)&local_38);
      std::__cxx11::string::~string((string *)&local_38);
      showProgress(this);
      return;
    }
    if (this->state == ACQUIRED) {
      puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
      *puVar2 = &PTR__exception_00198ac8;
      pcVar3 = "Invalid access token";
      goto LAB_0014503d;
    }
  }
  puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
  *puVar2 = &PTR__exception_00198ac8;
  pcVar3 = "Invalid ProgressReporter state";
LAB_0014503d:
  puVar2[1] = pcVar3;
  __cxa_throw(puVar2,&ProgressReporterException::typeinfo,std::exception::~exception);
}

Assistant:

void endReport(const std::string& p_token) {
        if (state == ProgressReporterStates::ACQUIRED && token == p_token) {
            timer->resetTimer();
            state = ProgressReporterStates::AVAILABLE;
            token = std::string();

            // Last call to {showProgress()} to make sure
            // progress has been shown to 100%
            showProgress();
        } else {
            if (state != ProgressReporterStates::ACQUIRED)
                throw ProgressReporterException("Invalid ProgressReporter state");
            else
                throw ProgressReporterException("Invalid access token");
        }
    }